

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

stbtt__point *
stbtt_FlattenCurves(stbtt_vertex *vertices,int num_verts,float objspace_flatness,
                   int **contour_lengths,int *num_contours,void *userdata)

{
  uchar uVar1;
  int n_00;
  void *pvVar2;
  long lVar3;
  float local_60;
  float local_5c;
  float y;
  float x;
  int pass;
  int start;
  int n;
  int i;
  float objspace_flatness_squared;
  int num_points;
  stbtt__point *points;
  void *userdata_local;
  int *num_contours_local;
  int **contour_lengths_local;
  float objspace_flatness_local;
  int num_verts_local;
  stbtt_vertex *vertices_local;
  
  _objspace_flatness_squared = (stbtt_vertex *)0x0;
  i = 0;
  pass = 0;
  x = 0.0;
  for (start = 0; start < num_verts; start = start + 1) {
    if (vertices[start].type == '\x01') {
      pass = pass + 1;
    }
  }
  *num_contours = pass;
  if (pass == 0) {
    vertices_local = (stbtt_vertex *)0x0;
  }
  else {
    points = (stbtt__point *)userdata;
    userdata_local = num_contours;
    num_contours_local = (int *)contour_lengths;
    contour_lengths_local._0_4_ = objspace_flatness;
    contour_lengths_local._4_4_ = num_verts;
    _objspace_flatness_local = vertices;
    pvVar2 = malloc((long)pass << 2);
    *(void **)num_contours_local = pvVar2;
    if (*(long *)num_contours_local == 0) {
      *(undefined4 *)userdata_local = 0;
      vertices_local = (stbtt_vertex *)0x0;
    }
    else {
      for (y = 0.0; (int)y < 2; y = (float)((int)y + 1)) {
        local_5c = 0.0;
        local_60 = 0.0;
        if ((y == 1.4013e-45) &&
           (_objspace_flatness_squared = (stbtt_vertex *)malloc((long)i << 3),
           _objspace_flatness_squared == (stbtt_vertex *)0x0)) {
          free((void *)0x0);
          free(*(void **)num_contours_local);
          num_contours_local[0] = 0;
          num_contours_local[1] = 0;
          *(undefined4 *)userdata_local = 0;
          return (stbtt__point *)0x0;
        }
        i = 0;
        pass = -1;
        for (start = 0; n_00 = i, start < contour_lengths_local._4_4_; start = start + 1) {
          uVar1 = _objspace_flatness_local[start].type;
          if (uVar1 == '\x01') {
            if (-1 < pass) {
              *(int *)(*(long *)num_contours_local + (long)pass * 4) = i - (int)x;
            }
            pass = pass + 1;
            x = (float)i;
            local_5c = (float)(int)_objspace_flatness_local[start].x;
            local_60 = (float)(int)_objspace_flatness_local[start].y;
            i = i + 1;
            stbtt__add_point((stbtt__point *)_objspace_flatness_squared,n_00,local_5c,local_60);
          }
          else if (uVar1 == '\x02') {
            local_5c = (float)(int)_objspace_flatness_local[start].x;
            local_60 = (float)(int)_objspace_flatness_local[start].y;
            i = i + 1;
            stbtt__add_point((stbtt__point *)_objspace_flatness_squared,n_00,local_5c,local_60);
          }
          else if (uVar1 == '\x03') {
            lVar3 = (long)start;
            stbtt__tesselate_curve
                      ((stbtt__point *)_objspace_flatness_squared,&i,local_5c,local_60,
                       (float)(int)_objspace_flatness_local[lVar3].cx,
                       (float)(int)_objspace_flatness_local[lVar3].cy,
                       (float)(int)_objspace_flatness_local[lVar3].x,
                       (float)(int)_objspace_flatness_local[lVar3].y,
                       objspace_flatness * objspace_flatness,0);
            local_5c = (float)(int)_objspace_flatness_local[start].x;
            local_60 = (float)(int)_objspace_flatness_local[start].y;
          }
        }
        *(int *)(*(long *)num_contours_local + (long)pass * 4) = i - (int)x;
      }
      vertices_local = _objspace_flatness_squared;
    }
  }
  return (stbtt__point *)vertices_local;
}

Assistant:

static stbtt__point *stbtt_FlattenCurves(stbtt_vertex *vertices, int num_verts, float objspace_flatness, int **contour_lengths, int *num_contours, void *userdata)
{
   stbtt__point *points=0;
   int num_points=0;

   float objspace_flatness_squared = objspace_flatness * objspace_flatness;
   int i,n=0,start=0, pass;

   // count how many "moves" there are to get the contour count
   for (i=0; i < num_verts; ++i)
      if (vertices[i].type == STBTT_vmove)
         ++n;

   *num_contours = n;
   if (n == 0) return 0;

   *contour_lengths = (int *) STBTT_malloc(sizeof(**contour_lengths) * n, userdata);

   if (*contour_lengths == 0) {
      *num_contours = 0;
      return 0;
   }

   // make two passes through the points so we don't need to realloc
   for (pass=0; pass < 2; ++pass) {
      float x=0,y=0;
      if (pass == 1) {
         points = (stbtt__point *) STBTT_malloc(num_points * sizeof(points[0]), userdata);
         if (points == NULL) goto error;
      }
      num_points = 0;
      n= -1;
      for (i=0; i < num_verts; ++i) {
         switch (vertices[i].type) {
            case STBTT_vmove:
               // start the next contour
               if (n >= 0)
                  (*contour_lengths)[n] = num_points - start;
               ++n;
               start = num_points;

               x = vertices[i].x, y = vertices[i].y;
               stbtt__add_point(points, num_points++, x,y);
               break;
            case STBTT_vline:
               x = vertices[i].x, y = vertices[i].y;
               stbtt__add_point(points, num_points++, x, y);
               break;
            case STBTT_vcurve:
               stbtt__tesselate_curve(points, &num_points, x,y,
                                        vertices[i].cx, vertices[i].cy,
                                        vertices[i].x,  vertices[i].y,
                                        objspace_flatness_squared, 0);
               x = vertices[i].x, y = vertices[i].y;
               break;
         }
      }
      (*contour_lengths)[n] = num_points - start;
   }

   return points;
error:
   STBTT_free(points, userdata);
   STBTT_free(*contour_lengths, userdata);
   *contour_lengths = 0;
   *num_contours = 0;
   return NULL;
}